

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleSingleSample>::init
          (MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleSingleSample> *this,
          EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleSingleSample> *local_10;
  MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleSingleSample> *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_MultisampleCaseBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_190,
                      (char (*) [134])
                      "Verifying that using interpolateAtSample with multisample buffers not available returns sample evaluated at the center of the pixel.\n"
                     );
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [56])
                             "\tInterpolate varying containing screen space location.\n");
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [63])
                             "\t=> fract(screen space location) should be (about) (0.5, 0.5)\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseInterpolateAtSampleSingleSample>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that using interpolateAtSample with multisample buffers not available returns sample evaluated at the center of the pixel.\n"
		<< "	Interpolate varying containing screen space location.\n"
		<< "	=> fract(screen space location) should be (about) (0.5, 0.5)\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}